

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

Byte ppmd_read(void *p)

{
  archive_read *a;
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  a = *p;
  pvVar1 = a->format->data;
  iVar3 = *(int *)((long)pvVar1 + 0x4ed0);
  if (iVar3 < 8) {
    iVar2 = rar_br_fillup(a,(rar_br *)((long)pvVar1 + 0x4ec8));
    iVar3 = *(int *)((long)pvVar1 + 0x4ed0);
    if (iVar3 < 8 && iVar2 == 0) {
      archive_set_error(&a->archive,0x54,"Truncated RAR file data");
      *(undefined1 *)((long)pvVar1 + 200) = 0;
      return '\0';
    }
  }
  *(int *)((long)pvVar1 + 0x4ed0) = iVar3 + -8;
  return (Byte)(*(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)(iVar3 + -8) & 0x3f));
}

Assistant:

static Byte
ppmd_read(void *p)
{
  struct archive_read *a = ((IByteIn*)p)->a;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  Byte b;
  if (!rar_br_read_ahead(a, br, 8))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return 0;
  }
  b = rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return b;
}